

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall duckdb::HistogramBinState<bool>::Destroy(HistogramBinState<bool> *this)

{
  _Bvector_base<std::allocator<bool>_> *this_00;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  
  this_00 = (_Bvector_base<std::allocator<bool>_> *)this->bin_boundaries;
  if (this_00 != (_Bvector_base<std::allocator<bool>_> *)0x0) {
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(this_00);
    operator_delete(this_00);
    this->bin_boundaries = (unsafe_vector<bool> *)0x0;
  }
  this_01 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts;
  if (this_01 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this_01);
    operator_delete(this_01);
    this->counts = (unsafe_vector<idx_t> *)0x0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}